

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O3

void __thiscall
mario::EPoller::fillActiveChannels(EPoller *this,int numEvents,ChannelList *activeChannels)

{
  pointer *pppCVar1;
  pointer peVar2;
  iterator __position;
  long lVar3;
  Channel *channel;
  Channel *local_30;
  
  if (0 < numEvents) {
    lVar3 = 0;
    do {
      peVar2 = (this->_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl
               .super__Vector_impl_data._M_start;
      local_30 = *(Channel **)((long)&peVar2->data + lVar3);
      local_30->_revents = *(int *)((long)&peVar2->events + lVar3);
      __position._M_current =
           (activeChannels->super__Vector_base<mario::Channel_*,_std::allocator<mario::Channel_*>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (activeChannels->super__Vector_base<mario::Channel_*,_std::allocator<mario::Channel_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<mario::Channel*,std::allocator<mario::Channel*>>::
        _M_realloc_insert<mario::Channel*const&>
                  ((vector<mario::Channel*,std::allocator<mario::Channel*>> *)activeChannels,
                   __position,&local_30);
      }
      else {
        *__position._M_current = local_30;
        pppCVar1 = &(activeChannels->
                    super__Vector_base<mario::Channel_*,_std::allocator<mario::Channel_*>_>)._M_impl
                    .super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
      lVar3 = lVar3 + 0xc;
    } while ((ulong)(uint)numEvents * 0xc != lVar3);
  }
  return;
}

Assistant:

void EPoller::fillActiveChannels(int numEvents, ChannelList* activeChannels) const {
    for (int i = 0; i < numEvents; ++i) {
        Channel* channel = static_cast<Channel*>(_events[i].data.ptr);
        channel->setRevents(_events[i].events);
        activeChannels->push_back(channel);
    }
}